

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O3

void __thiscall ktx::Reporter::fatal_usage<char_const(&)[62]>(Reporter *this,char (*args) [62])

{
  char *pcVar1;
  undefined8 *puVar2;
  Reporter *pRVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  format_string<std::__cxx11::basic_string<char>_&> fmt;
  format_string<> fmt_00;
  format_string<std::__cxx11::basic_string<char>_&> fmt_01;
  
  pcVar1 = (char *)std::char_traits<char>::length("{} fatal: ");
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = pcVar1;
  pRVar3 = this;
  ::fmt::v10::print<std::__cxx11::string&>((v10 *)&std::cerr,(ostream *)"{} fatal: ",fmt,in_R8);
  pcVar1 = (char *)std::char_traits<char>::length(*args);
  fmt_00.str_.size_ = (size_t)pRVar3;
  fmt_00.str_.data_ = pcVar1;
  ::fmt::v10::print<>((v10 *)&std::cerr,(ostream *)args,fmt_00);
  pcVar1 = (char *)std::char_traits<char>::length(" See \'{} --help\'.\n");
  fmt_01.str_.size_ = (size_t)this;
  fmt_01.str_.data_ = pcVar1;
  ::fmt::v10::print<std::__cxx11::string&>
            ((v10 *)&std::cerr,(ostream *)" See \'{} --help\'.\n",fmt_01,in_R8);
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar2 = &PTR__exception_0025b838;
  *(undefined4 *)(puVar2 + 1) = 1;
  __cxa_throw(puVar2,&FatalError::typeinfo,std::exception::~exception);
}

Assistant:

void fatal_usage(Args&&... args) {
        fmt::print(std::cerr, "{} fatal: ", commandName);
        fmt::print(std::cerr, std::forward<Args>(args)...);
        fmt::print(std::cerr, " See '{} --help'.\n", commandName);
        throw FatalError(rc::INVALID_ARGUMENTS);
    }